

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O1

void P_StartLinkedSectorInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t_conflict *sector,
               bool ceiling)

{
  uint uVar1;
  extsector_t *peVar2;
  long lVar3;
  DInterpolation *pDVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  peVar2 = sector->e;
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ceiling) << 4);
  if (*(int *)((long)&(peVar2->Linked).Floor.Sectors.Count + uVar5) != 0) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      lVar3 = *(long *)((long)&(peVar2->Linked).Floor.Sectors.Array + uVar5);
      if ((*(byte *)(lVar3 + lVar7) & 1) != 0) {
        pDVar4 = sector_t::SetInterpolation(*(sector_t **)(lVar3 + -8 + lVar7),1,false);
        TArray<DInterpolation_*,_DInterpolation_*>::Grow(list,1);
        uVar1 = list->Count;
        list->Array[uVar1] = pDVar4;
        list->Count = uVar1 + 1;
      }
      lVar3 = *(long *)((long)&(peVar2->Linked).Floor.Sectors.Array + uVar5);
      if ((*(byte *)(lVar3 + lVar7) & 2) != 0) {
        pDVar4 = sector_t::SetInterpolation(*(sector_t **)(lVar3 + -8 + lVar7),0,false);
        TArray<DInterpolation_*,_DInterpolation_*>::Grow(list,1);
        uVar1 = list->Count;
        list->Array[uVar1] = pDVar4;
        list->Count = uVar1 + 1;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < *(uint *)((long)&(peVar2->Linked).Floor.Sectors.Count + uVar5));
  }
  return;
}

Assistant:

void P_StartLinkedSectorInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::linked::plane &scrollplane = ceiling? sector->e->Linked.Ceiling : sector->e->Linked.Floor;

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Type & LINK_FLOOR)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::FloorMove, false));
		}
		if (scrollplane.Sectors[i].Type & LINK_CEILING)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::CeilingMove, false));
		}
	}
}